

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<QSettingsIniKey>::reserve(QList<QSettingsIniKey> *this,qsizetype asize)

{
  ArrayOptions *pAVar1;
  uint uVar2;
  Data *pDVar3;
  long lVar4;
  QSettingsIniKey *pQVar5;
  qsizetype qVar6;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QSettingsIniKey> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->d).d;
  if ((pDVar3 != (Data *)0x0) &&
     (asize <= (pDVar3->super_QArrayData).alloc -
               ((long)((long)(this->d).ptr -
                      ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 5))) {
    uVar2 = (pDVar3->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
            super_QFlagsStorage<QArrayData::ArrayOption>.i;
    if ((uVar2 & 1) != 0) goto LAB_00430b12;
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1) {
      (pDVar3->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
      super_QFlagsStorage<QArrayData::ArrayOption>.i = uVar2 | 1;
      goto LAB_00430b12;
    }
  }
  lVar4 = (this->d).size;
  if (asize < lVar4) {
    asize = lVar4;
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QSettingsIniKey *)
                 QArrayData::allocate((QArrayData **)&local_38,0x20,0x10,asize,KeepSize);
  local_38.size = 0;
  pQVar5 = (this->d).ptr;
  QtPrivate::QGenericArrayOps<QSettingsIniKey>::copyAppend
            ((QGenericArrayOps<QSettingsIniKey> *)&local_38,pQVar5,pQVar5 + (this->d).size);
  if (local_38.d != (Data *)0x0) {
    pAVar1 = &((local_38.d)->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  pDVar3 = (this->d).d;
  pQVar5 = (this->d).ptr;
  (this->d).d = local_38.d;
  (this->d).ptr = local_38.ptr;
  qVar6 = (this->d).size;
  (this->d).size = local_38.size;
  local_38.d = pDVar3;
  local_38.ptr = pQVar5;
  local_38.size = qVar6;
  QArrayDataPointer<QSettingsIniKey>::~QArrayDataPointer(&local_38);
LAB_00430b12:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}